

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsItemClicked(ImGuiMouseButton mouse_button)

{
  float fVar1;
  bool bVar2;
  
  fVar1 = (GImGui->IO).MouseDownDuration[mouse_button];
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    bVar2 = IsItemHovered(0);
    return bVar2;
  }
  return false;
}

Assistant:

bool ImGui::IsMouseClicked(ImGuiMouseButton button, bool repeat)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    const float t = g.IO.MouseDownDuration[button];
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}